

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_value_type xVar1;
  xpath_ast_node *pxVar2;
  binary_op_t bVar3;
  xpath_ast_node *local_a8;
  ast_type_t local_a0;
  undefined8 local_88;
  ast_type_t local_80;
  undefined8 local_68;
  ast_type_t local_60;
  undefined8 local_54;
  binary_op_t nextop;
  xpath_ast_node *rhs;
  ast_type_t local_38;
  undefined8 local_30;
  binary_op_t op;
  int limit_local;
  xpath_ast_node *lhs_local;
  xpath_parser *this_local;
  
  bVar3 = binary_op_t::parse(&this->_lexer);
  rhs = bVar3._0_8_;
  local_30 = rhs;
  local_38 = bVar3.precedence;
  op.asttype = local_38;
  unique0x10000143 = lhs;
  while( true ) {
    if ((ast_type_t)local_30 == ast_unknown || (int)op.asttype < limit) {
      return stack0xffffffffffffffe0;
    }
    xpath_lexer::next(&this->_lexer);
    nextop._4_8_ = parse_path_or_unary_expression(this);
    if ((xpath_ast_node *)nextop._4_8_ == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    bVar3 = binary_op_t::parse(&this->_lexer);
    local_68 = bVar3._0_8_;
    local_60 = bVar3.precedence;
    nextop.asttype = local_60;
    local_54 = local_68;
    while ((int)local_54 != 0 && (int)op.asttype < (int)nextop.asttype) {
      nextop._4_8_ = parse_expression_rec(this,(xpath_ast_node *)nextop._4_8_,nextop.asttype);
      if ((xpath_ast_node *)nextop._4_8_ == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar3 = binary_op_t::parse(&this->_lexer);
      local_88 = bVar3._0_8_;
      local_80 = bVar3.precedence;
      nextop.asttype = local_80;
      local_54 = local_88;
    }
    if (((ast_type_t)local_30 == ast_op_union) &&
       ((xVar1 = xpath_ast_node::rettype(stack0xffffffffffffffe0), xVar1 != xpath_type_node_set ||
        (xVar1 = xpath_ast_node::rettype((xpath_ast_node *)nextop._4_8_),
        xVar1 != xpath_type_node_set)))) break;
    register0x00000000 =
         alloc_node(this,(ast_type_t)local_30,local_30._4_4_,stack0xffffffffffffffe0,
                    (xpath_ast_node *)nextop._4_8_);
    if (register0x00000000 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    bVar3 = binary_op_t::parse(&this->_lexer);
    local_a8 = bVar3._0_8_;
    local_a0 = bVar3.precedence;
    local_30 = local_a8;
    op.asttype = local_a0;
  }
  pxVar2 = error(this,"Union operator has to be applied to node sets");
  return pxVar2;
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return 0;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return 0;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return 0;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}